

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O1

void do_cmd_pref_file_hack(long row)

{
  wchar_t row_00;
  _Bool _Var1;
  char *pcVar2;
  char ftmp [80];
  char acStack_68 [80];
  
  screen_save();
  row_00 = (wchar_t)row;
  prt("",row_00 + L'\xffffffff',L'\0');
  prt("Command: Load a user pref file",row_00,L'\0');
  prt("",row_00 + L'\x01',L'\0');
  prt("File: ",row_00 + L'\x02',L'\0');
  prt("",row_00 + L'\x03',L'\0');
  player_safe_name(acStack_68,0x50,player->full_name,true);
  my_strcat(acStack_68,".prf",0x50);
  if (arg_force_name == false) {
    _Var1 = askfor_aux(acStack_68,0x50,
                       (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
  }
  else {
    pcVar2 = format("Confirm loading %s? ");
    _Var1 = get_check(pcVar2);
  }
  if (_Var1 != false) {
    _Var1 = process_pref_file(acStack_68,false,true);
    prt("",L'\0',L'\0');
    pcVar2 = "Failed to load \'%s\'!";
    if (_Var1) {
      pcVar2 = "Loaded \'%s\'.";
    }
    msg(pcVar2,acStack_68);
  }
  screen_load();
  return;
}

Assistant:

static void do_cmd_pref_file_hack(long row)
{
	char ftmp[80];
	bool ok;

	screen_save();

	/* Prompt */
	if (row > 0) {
		prt("", row - 1, 0);
	}
	prt("Command: Load a user pref file", row, 0);
	prt("", row + 1, 0);
	prt("File: ", row + 2, 0);
	prt("", row + 3, 0);

	/* Get the filesystem-safe name and append .prf */
	player_safe_name(ftmp, sizeof(ftmp), player->full_name, true);
	my_strcat(ftmp, ".prf", sizeof(ftmp));

	if(!arg_force_name)
		ok = askfor_aux(ftmp, sizeof ftmp, NULL);
	else
		ok = get_check(format("Confirm loading %s? ", ftmp));
	
	/* Ask for a file (or cancel) */
	if(ok) {
		/* Process the given filename */
		if (process_pref_file(ftmp, false, true) == false) {
			/* Mention failure */
			prt("", 0, 0);
			msg("Failed to load '%s'!", ftmp);
		} else {
			/* Mention success */
			prt("", 0, 0);
			msg("Loaded '%s'.", ftmp);
		}
	}

	screen_load();
}